

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

U32 ZSTD_btGetAllMatches_noDict_4
              (ZSTD_match_t *matches,ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip,
              BYTE *iHighLimit,U32 *rep,U32 ll0,U32 lengthToBeat)

{
  ulong *puVar1;
  ulong *puVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  U32 UVar7;
  int iVar8;
  ulong uVar9;
  ulong *puVar10;
  uint uVar11;
  ulong *puVar12;
  U32 *pUVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong *puVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  U32 UVar22;
  ulong *puVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  BYTE *pBVar28;
  bool bVar29;
  BYTE *pInLoopLimit;
  uint local_ec;
  uint local_e8;
  ulong local_d0;
  ulong local_c8;
  U32 *local_a8;
  U32 *local_a0;
  U32 local_84;
  ulong *local_80;
  ulong *local_78;
  ulong local_70;
  ZSTD_match_t *local_68;
  U32 *local_60;
  ulong local_58;
  ulong *local_50;
  U32 *local_48;
  BYTE *local_40;
  ulong local_38;
  
  local_68 = matches;
  if ((ms->cParams).minMatch != 4) {
    __assert_fail("BOUNDED(3, ms->cParams.minMatch, 6) == mls",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8263,
                  "U32 ZSTD_btGetAllMatches_internal(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *, const BYTE *const, const U32 *, const U32, const U32, const ZSTD_dictMode_e, const U32)"
                 );
  }
  pBVar28 = (ms->window).base;
  uVar27 = (ulong)ms->nextToUpdate;
  UVar7 = 0;
  if (pBVar28 + uVar27 <= ip) {
    while( true ) {
      uVar26 = (uint)uVar27;
      uVar14 = (uint)((long)ip - (long)pBVar28);
      if (uVar14 <= uVar26) break;
      UVar7 = ZSTD_insertBt1(ms,pBVar28 + uVar27,iHighLimit,uVar14,4,0);
      uVar27 = (ulong)(UVar7 + uVar26);
      if (UVar7 + uVar26 <= uVar26) {
        __assert_fail("idx < (U32)(idx + forward)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x815a,
                      "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                     );
      }
    }
    if ((ulong)((long)ip - (long)pBVar28) >> 0x20 != 0) {
      __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x815d,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    if ((ulong)((long)iHighLimit - (long)pBVar28) >> 0x20 != 0) {
      __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x815e,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    ms->nextToUpdate = uVar14;
    uVar14 = (ms->cParams).targetLength;
    uVar26 = 0xfff;
    if (uVar14 < 0xfff) {
      uVar26 = uVar14;
    }
    uVar14 = (ms->cParams).hashLog;
    if (0x20 < uVar14) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    local_40 = (ms->window).base;
    uVar19 = (int)ip - (int)local_40;
    local_58 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar14 & 0x1fU));
    uVar21 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    UVar7 = (ms->window).lowLimit;
    uVar14 = uVar19 - uVar21;
    local_ec = 0;
    if (uVar19 < uVar21) {
      uVar14 = 0;
    }
    uVar15 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar22 = uVar19 - uVar15;
    if (uVar19 - UVar7 <= uVar15) {
      UVar22 = UVar7;
    }
    if (ms->loadedDictEnd != 0) {
      UVar22 = UVar7;
    }
    uVar15 = UVar22 + (UVar22 == 0);
    uVar16 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    if (1 < ll0) {
      __assert_fail("ll0 <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x819e,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    local_60 = ms->hashTable;
    uVar24 = local_60[local_58];
    local_48 = ms->chainTable;
    uVar3 = (ms->window).dictLimit;
    uVar27 = (ulong)uVar3;
    uVar9 = (ulong)((uVar21 & uVar19) * 2);
    local_a8 = local_48 + uVar9;
    local_a0 = local_48 + uVar9 + 1;
    local_e8 = uVar19 + 9;
    uVar9 = (ulong)(lengthToBeat - 1);
    local_38 = (ulong)(ll0 + 3);
    puVar2 = (ulong *)(ip + 4);
    puVar1 = (ulong *)(iHighLimit + -7);
    local_50 = (ulong *)(ip + 0xc);
    local_78 = (ulong *)(iHighLimit + -3);
    local_80 = (ulong *)(iHighLimit + -1);
    bVar29 = true;
    uVar20 = (ulong)ll0;
    puVar10 = local_80;
    do {
      if (uVar20 == 3) {
        uVar11 = *rep - 1;
      }
      else {
        uVar11 = rep[uVar20];
      }
      local_70 = uVar27;
      if (uVar19 < uVar3) {
        __assert_fail("curr >= dictLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81a5,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (uVar11 - 1 < uVar19 - uVar3) {
        uVar25 = 0;
        if ((UVar22 <= uVar19 - uVar11) && (*(int *)ip == *(int *)(ip + -(ulong)uVar11))) {
          puVar12 = (ulong *)((long)puVar2 - (ulong)uVar11);
          puVar18 = puVar2;
          if (puVar2 < puVar1) {
            uVar17 = *puVar2 ^ *puVar12;
            uVar25 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
              }
            }
            uVar25 = uVar25 >> 3 & 0x1fffffff;
            iVar8 = (int)uVar25;
            puVar18 = local_50;
            if (*puVar12 == *puVar2) {
              do {
                puVar12 = puVar12 + 1;
                if (puVar1 <= puVar18) goto LAB_001d06d3;
                uVar17 = *puVar12;
                uVar4 = *puVar18;
                uVar5 = 0;
                if ((uVar4 ^ uVar17) != 0) {
                  for (; ((uVar4 ^ uVar17) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                  }
                }
                puVar23 = (ulong *)((uVar5 >> 3 & 0x1fffffff) + (long)puVar18);
                puVar18 = puVar18 + 1;
                if (uVar17 != uVar4) {
                  uVar25 = (long)puVar23 - (long)puVar2;
                  puVar18 = puVar23;
                }
                iVar8 = (int)uVar25;
              } while (uVar17 == uVar4);
            }
          }
          else {
LAB_001d06d3:
            if ((puVar18 < local_78) && ((int)*puVar12 == (int)*puVar18)) {
              puVar18 = (ulong *)((long)puVar18 + 4);
              puVar12 = (ulong *)((long)puVar12 + 4);
            }
            if ((puVar18 < local_80) && ((short)*puVar12 == (short)*puVar18)) {
              puVar18 = (ulong *)((long)puVar18 + 2);
              puVar12 = (ulong *)((long)puVar12 + 2);
            }
            if (puVar18 < iHighLimit) {
              puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar12 == (char)*puVar18));
            }
            iVar8 = (int)puVar18 - (int)puVar2;
          }
          uVar25 = (ulong)(iVar8 + 4);
        }
      }
      else {
        uVar25 = 0;
        if (uVar19 < UVar22) {
          __assert_fail("curr >= windowLow",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x81b1,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
      }
      uVar11 = (uint)uVar25;
      bVar6 = true;
      if (uVar9 < uVar25) {
        uVar9 = (ulong)local_ec;
        local_68[uVar9].off = ((int)uVar20 - ll0) + 1;
        local_ec = local_ec + 1;
        local_68[uVar9].len = uVar11;
        bVar6 = ip + uVar25 != iHighLimit && uVar11 <= uVar26;
        puVar10 = (ulong *)((ulong)puVar10 & 0xffffffff);
        uVar9 = uVar25;
        if (ip + uVar25 == iHighLimit || uVar11 > uVar26) {
          puVar10 = (ulong *)(ulong)local_ec;
        }
      }
      if (!bVar6) break;
      uVar20 = uVar20 + 1;
      bVar29 = uVar20 < local_38;
    } while (uVar20 != local_38);
    UVar7 = (U32)puVar10;
    if (!bVar29) {
      local_60[local_58] = uVar19;
      if (uVar15 <= uVar24) {
        local_d0 = 0;
        local_c8 = 0;
        do {
          uVar20 = local_c8;
          if (local_d0 < local_c8) {
            uVar20 = local_d0;
          }
          if (uVar19 <= uVar24) {
            __assert_fail("curr > matchIndex",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x81f1,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          if (uVar20 + uVar24 < uVar27) {
            __assert_fail("matchIndex+matchLength >= dictLimit",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x81f4,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          pBVar28 = local_40 + uVar24;
          if (((uint)uVar27 <= uVar24) &&
             (iVar8 = bcmp(pBVar28,ip,uVar20), uVar27 = local_70, iVar8 != 0)) {
            __assert_fail("memcmp(match, ip, matchLength) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x81f6,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          puVar2 = (ulong *)(ip + uVar20);
          puVar18 = (ulong *)(pBVar28 + uVar20);
          puVar10 = puVar2;
          if (puVar2 < puVar1) {
            uVar17 = *puVar2 ^ *puVar18;
            uVar25 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
              }
            }
            uVar25 = uVar25 >> 3 & 0x1fffffff;
            if (*puVar18 == *puVar2) {
              do {
                puVar10 = puVar10 + 1;
                puVar18 = puVar18 + 1;
                if (puVar1 <= puVar10) goto LAB_001d0914;
                uVar17 = *puVar10 ^ *puVar18;
                uVar25 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                  }
                }
                uVar25 = (long)puVar10 + ((uVar25 >> 3 & 0x1fffffff) - (long)puVar2);
              } while (*puVar18 == *puVar10);
            }
          }
          else {
LAB_001d0914:
            if ((puVar10 < local_78) && ((int)*puVar18 == (int)*puVar10)) {
              puVar10 = (ulong *)((long)puVar10 + 4);
              puVar18 = (ulong *)((long)puVar18 + 4);
            }
            if ((puVar10 < local_80) && ((short)*puVar18 == (short)*puVar10)) {
              puVar10 = (ulong *)((long)puVar10 + 2);
              puVar18 = (ulong *)((long)puVar18 + 2);
            }
            if (puVar10 < iHighLimit) {
              puVar10 = (ulong *)((long)puVar10 + (ulong)((char)*puVar18 == (char)*puVar10));
            }
            uVar25 = (long)puVar10 - (long)puVar2;
          }
          uVar25 = uVar25 + uVar20;
          if (uVar9 < uVar25) {
            if (local_e8 < uVar24 || local_e8 - uVar24 == 0) {
              __assert_fail("matchEndIdx > matchIndex",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x8203,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if (uVar24 == uVar19) {
              __assert_fail("(curr - matchIndex)>0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x8207,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if (local_e8 - uVar24 < uVar25) {
              local_e8 = uVar24 + (U32)uVar25;
            }
            local_68[local_ec].off = (uVar19 + 3) - uVar24;
            local_68[local_ec].len = (U32)uVar25;
            local_ec = local_ec + 1;
            uVar9 = uVar25;
            if (ip + uVar25 != iHighLimit && uVar25 < 0x1001) goto LAB_001d09df;
            bVar29 = false;
          }
          else {
LAB_001d09df:
            pUVar13 = local_48 + (uVar24 & uVar21) * 2;
            if (pBVar28[uVar25] < ip[uVar25]) {
              *local_a8 = uVar24;
              local_d0 = uVar25;
              if (uVar14 < uVar24) {
                pUVar13 = pUVar13 + 1;
                local_a8 = pUVar13;
LAB_001d0a46:
                uVar24 = *pUVar13;
                bVar29 = true;
              }
              else {
                bVar29 = false;
                local_a8 = &local_84;
              }
            }
            else {
              *local_a0 = uVar24;
              local_c8 = uVar25;
              local_a0 = pUVar13;
              if (uVar14 < uVar24) goto LAB_001d0a46;
              bVar29 = false;
              local_a0 = &local_84;
            }
          }
        } while (((bVar29) && (uVar16 = uVar16 - 1, uVar16 != 0)) && (uVar15 <= uVar24));
      }
      *local_a0 = 0;
      *local_a8 = 0;
      if (0x40000000 < uVar16) {
        __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8221,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (local_e8 <= uVar19 + 8) {
        __assert_fail("matchEndIdx > curr+8",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8248,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      ms->nextToUpdate = local_e8 - 8;
      UVar7 = local_ec;
    }
  }
  return UVar7;
}

Assistant:

GEN_ZSTD_BT_GET_ALL_MATCHES(noDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(extDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(dictMatchState)

#define ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMode)  \
    {                                            \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 3), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 4), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 5), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 6)  \
    }

static ZSTD_getAllMatchesFn
ZSTD_selectBtGetAllMatches(ZSTD_matchState_t const* ms, ZSTD_dictMode_e const dictMode)
{
    ZSTD_getAllMatchesFn const getAllMatchesFns[3][4] = {
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(noDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(extDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMatchState)
    };
    U32 const mls = BOUNDED(3, ms->cParams.minMatch, 6);
    assert((U32)dictMode < 3);
    assert(mls - 3 < 4);
    return getAllMatchesFns[(int)dictMode][mls - 3];
}

/*************************
*  LDM helper functions  *
*************************/

/* Struct containing info needed to make decision about ldm inclusion */
typedef struct {
    rawSeqStore_t seqStore;   /* External match candidates store for this block */
    U32 startPosInBlock;      /* Start position of the current match candidate */
    U32 endPosInBlock;        /* End position of the current match candidate */
    U32 offset;               /* Offset of the match candidate */
} ZSTD_optLdm_t;

/* ZSTD_optLdm_skipRawSeqStoreBytes():
 * Moves forward in @rawSeqStore by @nbBytes,
 * which will update the fields 'pos' and 'posInSequence'.
 */
static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}